

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroupCollection::InitializeScanWithOffset
          (RowGroupCollection *this,CollectionScanState *state,
          vector<duckdb::StorageIndex,_true> *column_ids,idx_t start_row,idx_t end_row)

{
  bool bVar1;
  RowGroupSegmentTree *this_00;
  RowGroup *this_01;
  InternalException *this_02;
  allocator local_51;
  string local_50;
  
  this_00 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  this_01 = SegmentTree<duckdb::RowGroup,_true>::GetSegment
                      (&this_00->super_SegmentTree<duckdb::RowGroup,_true>,start_row);
  state->row_groups =
       (this->row_groups).internal.
       super___shared_ptr<duckdb::RowGroupSegmentTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  state->max_row = end_row;
  CollectionScanState::Initialize(state,&this->types);
  bVar1 = RowGroup::InitializeScanWithOffset
                    (this_01,state,
                     start_row - (this_01->super_SegmentBase<duckdb::RowGroup>).start >> 0xb);
  if (bVar1) {
    return;
  }
  this_02 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,"Failed to initialize row group scan with offset",&local_51);
  InternalException::InternalException(this_02,&local_50);
  __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void RowGroupCollection::InitializeScanWithOffset(CollectionScanState &state, const vector<StorageIndex> &column_ids,
                                                  idx_t start_row, idx_t end_row) {
	auto row_group = row_groups->GetSegment(start_row);
	D_ASSERT(row_group);
	state.row_groups = row_groups.get();
	state.max_row = end_row;
	state.Initialize(GetTypes());
	idx_t start_vector = (start_row - row_group->start) / STANDARD_VECTOR_SIZE;
	if (!row_group->InitializeScanWithOffset(state, start_vector)) {
		throw InternalException("Failed to initialize row group scan with offset");
	}
}